

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

void __thiscall
pbrt::PMJ02BNSampler::PMJ02BNSampler
          (PMJ02BNSampler *this,int samplesPerPixel,int seed,Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  int iVar6;
  vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_> *pvVar7;
  char (*args_2) [11];
  reference pvVar8;
  Tuple2<pbrt::Point2,_float> *pTVar9;
  ulong uVar10;
  size_type sVar11;
  undefined4 in_EDX;
  int in_ESI;
  char (*in_RDI) [16];
  Point2<float> PVar12;
  Vector2<float> VVar13;
  undefined8 extraout_XMM0_Qb;
  char (*extraout_XMM0_Qb_00) [47];
  undefined8 extraout_XMM0_Qb_01;
  int c;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int vb;
  value_type va;
  int i_1;
  int sampleOffset;
  int pixelOffset;
  Point2f p;
  int i;
  vector<int,_std::allocator<int>_> nStored;
  int nPixelSamples;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffea8;
  Tuple2<pbrt::Vector2,_float> in_stack_fffffffffffffeb0;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffeb8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  char (*in_stack_fffffffffffffef0) [47];
  char (*in_stack_fffffffffffffef8) [16];
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  Tuple2<pbrt::Point2,_float> *in_stack_ffffffffffffff08;
  LogLevel in_stack_ffffffffffffff14;
  Tuple2<pbrt::Point2,_float> in_stack_ffffffffffffff18;
  undefined4 uStack_e0;
  LogLevel in_stack_ffffffffffffff24;
  int *args_3;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  vector<int,_std::allocator<int>_> *local_a0;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  Tuple2<pbrt::Point2,_float> local_70;
  Tuple2<pbrt::Point2,_float> local_68;
  int local_60;
  int local_5c;
  undefined8 local_58;
  int local_50;
  undefined1 local_3d [5];
  vector<int,_std::allocator<int>_> local_38;
  int local_1c;
  int local_14;
  
  *(int *)*in_RDI = in_ESI;
  *(undefined4 *)(*in_RDI + 4) = in_EDX;
  local_14 = in_ESI;
  Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffeb0);
  bVar4 = IsPowerOf4<int>(0);
  if (!bVar4) {
    Warning<>(in_stack_fffffffffffffee0);
  }
  if (0x10000 < local_14) {
    Error<int_const&>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  iVar5 = Log4Int<int>(0);
  RoundUpPow4<int>(0);
  iVar6 = Log4Int<int>(0);
  *(int *)(*in_RDI + 8) = 1 << (iVar5 - iVar6 & 0x1fU);
  local_1c = *(int *)(*in_RDI + 8) * *(int *)(*in_RDI + 8) * local_14;
  pvVar7 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pstd::vector<pbrt::Point2<float>,pstd::pmr::polymorphic_allocator<pbrt::Point2<float>>>,int&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffec0,
                      (int *)in_stack_fffffffffffffeb8,
                      (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffeb0);
  *(vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_> **)
   in_RDI[1] = pvVar7;
  args_2 = (char (*) [11])(ulong)(uint)(*(int *)(*in_RDI + 8) * *(int *)(*in_RDI + 8));
  local_3d._1_4_ = 0;
  args_3 = (int *)local_3d;
  std::allocator<int>::allocator((allocator<int> *)0x93f90f);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (value_type_conflict *)in_stack_fffffffffffffec0,
             (allocator_type *)in_stack_fffffffffffffeb8);
  std::allocator<int>::~allocator((allocator<int> *)0x93f943);
  local_50 = 0;
  do {
    if (0xffff < local_50) {
      local_8c = 0;
      while( true ) {
        uVar10 = (ulong)local_8c;
        sVar11 = std::vector<int,_std::allocator<int>_>::size(&local_38);
        if (sVar11 <= uVar10) {
          local_a0 = &local_38;
          local_a8._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea8);
          std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea8);
          while (bVar4 = __gnu_cxx::operator!=
                                   ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_fffffffffffffeb0,
                                    (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_fffffffffffffea8), bVar4) {
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                      (&local_a8);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&local_a8);
          }
          std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffec0);
          return;
        }
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_8c);
        local_90 = *pvVar8;
        local_94 = local_14;
        if (local_90 != local_14) break;
        local_8c = local_8c + 1;
      }
      LogFatal<char_const(&)[11],char_const(&)[16],char_const(&)[11],int&,char_const(&)[16],int&>
                (in_stack_ffffffffffffff24,(char *)in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff08,
                 (char (*) [11])CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8,args_2,args_3,in_RDI,
                 (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    in_stack_ffffffffffffff18 =
         (Tuple2<pbrt::Point2,_float>)
         GetPMJ02BNSample((int)in_stack_fffffffffffffea8.y,(int)in_stack_fffffffffffffea8.x);
    uStack_e0 = (undefined4)extraout_XMM0_Qb;
    in_stack_ffffffffffffff24 = (LogLevel)((ulong)extraout_XMM0_Qb >> 0x20);
    auVar3._8_4_ = uStack_e0;
    auVar3._0_4_ = in_stack_ffffffffffffff18.x;
    auVar3._4_4_ = in_stack_ffffffffffffff18.y;
    auVar3._12_4_ = in_stack_ffffffffffffff24;
    local_58 = vmovlpd_avx(auVar3);
    Tuple2<pbrt::Point2,float>::operator*=
              ((Tuple2<pbrt::Point2,float> *)&local_58,*(int *)(*in_RDI + 8));
    local_5c = (int)(float)local_58 + (int)local_58._4_4_ * *(int *)(*in_RDI + 8);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_5c);
    if (*pvVar8 == local_14) {
      bVar4 = IsPowerOf4<int>(0);
      in_stack_ffffffffffffff14 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffff14);
      if (bVar4) {
        LogFatal<char_const(&)[29]>
                  (in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff08,
                   in_stack_ffffffffffffff04,*in_stack_fffffffffffffef8,
                   (char (*) [29])in_stack_fffffffffffffef0);
      }
    }
    else {
      in_stack_ffffffffffffff04 = local_5c * local_14;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_5c);
      local_60 = in_stack_ffffffffffffff04 + *pvVar8;
      in_stack_ffffffffffffff08 =
           &pstd::
            vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>::
            operator[](*(vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>
                         **)in_RDI[1],(long)local_60)->super_Tuple2<pbrt::Point2,_float>;
      Point2<float>::Point2
                ((Point2<float> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8.y,
                 in_stack_fffffffffffffea8.x);
      bVar4 = Tuple2<pbrt::Point2,_float>::operator==
                        (in_stack_ffffffffffffff08,(Point2<float>)local_68);
      in_stack_ffffffffffffff00 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffff00);
      if (!bVar4) {
        LogFatal<char_const(&)[47]>
                  (in_stack_ffffffffffffff14,(char *)in_stack_ffffffffffffff08,
                   in_stack_ffffffffffffff04,*in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      }
      local_88 = local_58;
      PVar12 = Floor<pbrt::Point2,float>(in_stack_fffffffffffffea8);
      auVar2._8_8_ = extraout_XMM0_Qb_00;
      auVar2._0_4_ = PVar12.super_Tuple2<pbrt::Point2,_float>.x;
      auVar2._4_4_ = PVar12.super_Tuple2<pbrt::Point2,_float>.y;
      local_80 = vmovlpd_avx(auVar2);
      in_stack_fffffffffffffef0 = extraout_XMM0_Qb_00;
      VVar13 = Point2<float>::operator-
                         (in_stack_fffffffffffffeb0,(Point2<float>)in_stack_fffffffffffffeb8);
      auVar1._8_8_ = extraout_XMM0_Qb_01;
      auVar1._0_4_ = VVar13.super_Tuple2<pbrt::Vector2,_float>.x;
      auVar1._4_4_ = VVar13.super_Tuple2<pbrt::Vector2,_float>.y;
      local_78 = vmovlpd_avx(auVar1);
      Point2<float>::Point2<float>
                ((Point2<float> *)in_stack_fffffffffffffea8,
                 (Vector2<float>)in_stack_fffffffffffffeb0);
      pTVar9 = &pstd::
                vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>
                ::operator[](*(vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>
                               **)in_RDI[1],(long)local_60)->super_Tuple2<pbrt::Point2,_float>;
      *pTVar9 = local_70;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_5c);
      *pvVar8 = *pvVar8 + 1;
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

PMJ02BNSampler::PMJ02BNSampler(int samplesPerPixel, int seed, Allocator alloc)
    : samplesPerPixel(samplesPerPixel), seed(seed) {
    if (!IsPowerOf4(samplesPerPixel))
        Warning("PMJ02BNSampler results are best with power-of-4 samples per "
                "pixel (1, 4, 16, 64, ...)");
    // Get sorted pmj02bn samples for pixel samples
    if (samplesPerPixel > nPMJ02bnSamples)
        Error("PMJ02BNSampler only supports up to %d samples per pixel", nPMJ02bnSamples);
    // Compute _pixelTileSize_ for pmj02bn pixel samples and allocate _pixelSamples_
    pixelTileSize =
        1 << (Log4Int(nPMJ02bnSamples) - Log4Int(RoundUpPow4(samplesPerPixel)));
    int nPixelSamples = pixelTileSize * pixelTileSize * samplesPerPixel;
    pixelSamples = alloc.new_object<pstd::vector<Point2f>>(nPixelSamples, alloc);

    // Loop over pmj02bn samples and associate them with their pixels
    std::vector<int> nStored(pixelTileSize * pixelTileSize, 0);
    for (int i = 0; i < nPMJ02bnSamples; ++i) {
        Point2f p = GetPMJ02BNSample(0, i);
        p *= pixelTileSize;
        int pixelOffset = int(p.x) + int(p.y) * pixelTileSize;
        if (nStored[pixelOffset] == samplesPerPixel) {
            CHECK(!IsPowerOf4(samplesPerPixel));
            continue;
        }
        int sampleOffset = pixelOffset * samplesPerPixel + nStored[pixelOffset];
        CHECK((*pixelSamples)[sampleOffset] == Point2f(0, 0));
        (*pixelSamples)[sampleOffset] = Point2f(p - Floor(p));
        ++nStored[pixelOffset];
    }

    for (int i = 0; i < nStored.size(); ++i)
        CHECK_EQ(nStored[i], samplesPerPixel);
    for (int c : nStored)
        DCHECK_EQ(c, samplesPerPixel);
}